

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O0

void file_handle_seek(t_file_handle *x,t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  _outlet *x_00;
  int iVar2;
  __off_t _Var3;
  t_symbol *ptVar4;
  t_float tVar5;
  undefined1 local_48 [8];
  t_atom a [1];
  long lStack_30;
  int whence;
  off_t offset;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_file_handle *x_local;
  
  lStack_30 = 0;
  a[0].a_w._4_4_ = 0;
  if (argc == 0) {
    a[0].a_w._4_4_ = 1;
LAB_001be129:
    iVar2 = file_handle_checkopen(x,"seek");
    if (iVar2 != 0) {
      _Var3 = lseek(x->x_fhptr->fh_fd,lStack_30,a[0].a_w._4_4_);
      local_48._0_4_ = A_FLOAT;
      a[0].a_type = (t_atomtype)(float)_Var3;
      x_00 = x->x_infoout;
      ptVar4 = gensym("seek");
      outlet_anything(x_00,ptVar4,1,(t_atom *)local_48);
    }
  }
  else {
    if (argc == 1) {
LAB_001be104:
      if (argv->a_type == A_FLOAT) {
        tVar5 = atom_getfloat(argv);
        lStack_30 = (long)(int)tVar5;
        goto LAB_001be129;
      }
    }
    else {
      if (argc != 2) goto LAB_001be129;
      if (argv[1].a_type == A_SYMBOL) {
        ptVar4 = atom_getsymbol(argv + 1);
        cVar1 = *ptVar4->s_name;
        if (cVar1 == '\0') goto LAB_001be0d0;
        if (cVar1 != 'C') {
          if (cVar1 == 'E') {
LAB_001be0d9:
            a[0].a_w._4_4_ = 2;
            goto LAB_001be104;
          }
          if (cVar1 != 'R') {
            if (cVar1 == 'S') {
LAB_001be0d0:
              a[0].a_w._4_4_ = 0;
              goto LAB_001be104;
            }
            if (cVar1 != 'c') {
              if (cVar1 == 'e') goto LAB_001be0d9;
              if (cVar1 != 'r') {
                if (cVar1 != 's') {
                  pd_error(x,
                           "seek mode must be \'set\', \'end\' or \'current\' (resp. \'relative\')")
                  ;
                  return;
                }
                goto LAB_001be0d0;
              }
            }
          }
        }
        a[0].a_w._4_4_ = 1;
        goto LAB_001be104;
      }
    }
    pd_error(x,"usage: seek [<int:offset> [<symbol:mode>]]");
  }
  return;
}

Assistant:

static void file_handle_seek(t_file_handle*x, t_symbol*s, int argc, t_atom*argv) {
    off_t offset=0;
    int whence = SEEK_SET;
    t_atom a[1];
    switch(argc) {
    case 0:
            /* just output the current position */
        whence=SEEK_CUR;
        break;
    case 2: {
        if (A_SYMBOL!=argv[1].a_type)
            goto usage;
        s=atom_getsymbol(argv+1);
        switch(*s->s_name) {
        case 'S': case 's': case 0:
            whence = SEEK_SET;
            break;
        case 'E': case 'e':
            whence = SEEK_END;
            break;
        case 'C': case 'c': case 'R': case 'r':
            whence = SEEK_CUR;
            break;
        default:
            pd_error(x, "seek mode must be 'set', 'end' or 'current' (resp. 'relative')");
            return;
        }
    }
            /* falls through */
    case 1:
        if (A_FLOAT!=argv[0].a_type)
            goto usage;
        offset = (int)atom_getfloat(argv);
        break;
    }

    if(!file_handle_checkopen(x, "seek"))
        return;
    offset = lseek(x->x_fd, offset, whence);
    SETFLOAT(a, offset);
    outlet_anything(x->x_infoout, gensym("seek"), 1, a);
    return;
 usage:
    pd_error(x, "usage: seek [<int:offset> [<symbol:mode>]]");
}